

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *piMinKey,i64 maxKey)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  BtShared *pBt;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  MemPage *pMVar10;
  ushort uVar11;
  u16 uVar12;
  int iVar13;
  uint uVar14;
  u32 uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ushort *puVar19;
  uint uVar20;
  uint uVar21;
  char *zFormat;
  u32 *aHeap;
  u8 *puVar22;
  u8 *puVar23;
  ulong uVar24;
  int local_f8;
  i64 maxKey_local;
  MemPage *local_c8;
  u8 *local_c0;
  BtShared *local_b8;
  ulong local_b0;
  MemPage *pPage;
  int local_9c;
  uint local_98;
  uint local_94;
  u8 *local_90;
  ulong local_88;
  CellInfo info;
  
  pPage = (MemPage *)0x0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar5 = pCheck->zPfx;
  iVar8 = pCheck->v1;
  iVar9 = pCheck->v2;
  uVar14 = pBt->usableSize;
  maxKey_local = maxKey;
  iVar13 = checkRef(pCheck,iPage);
  if (iVar13 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  local_b0 = (ulong)uVar14;
  uVar14 = btreeGetPage(pBt,iPage,&pPage,0);
  pMVar10 = pPage;
  local_f8 = -1;
  if (uVar14 == 0) {
    uVar1 = pPage->isInit;
    pPage->isInit = '\0';
    local_b8 = pBt;
    uVar14 = btreeInitPage(pPage);
    if (uVar14 == 0) {
      local_c0 = pMVar10->aData;
      bVar2 = pMVar10->hdrOffset;
      uVar17 = (ulong)bVar2;
      pCheck->zPfx = "On tree page %d cell %d: ";
      local_90 = local_c0 + uVar17;
      uVar14 = ((uint)local_c0[uVar17 + 5] * 0x100 + (uint)local_c0[uVar17 + 6]) - 1 & 0xffff;
      uVar18 = (uint)local_c0[uVar17 + 3] * 0x100;
      bVar3 = local_c0[uVar17 + 4];
      local_88 = (ulong)bVar3;
      bVar4 = pMVar10->leaf;
      local_c8 = pMVar10;
      if (bVar4 == 0) {
        uVar15 = sqlite3Get4byte(local_90 + 8);
        if (local_b8->autoVacuum != '\0') {
          pCheck->zPfx = "On page %d at right child: ";
          checkPtrmap(pCheck,uVar15,'\x05',iPage);
        }
        local_f8 = checkTreePage(pCheck,uVar15,&maxKey_local,maxKey);
        aHeap = (u32 *)0x0;
        bVar6 = false;
      }
      else {
        aHeap = pCheck->heap;
        *aHeap = 0;
        local_f8 = -1;
        bVar6 = true;
      }
      bVar7 = true;
      local_94 = uVar14 + 1;
      iVar13 = (uVar18 - 1) + (int)local_88;
      puVar19 = (ushort *)
                (local_c0 +
                (long)(int)((uint)bVar2 + (uint)bVar4 * -4 + (bVar3 + uVar18) * 2 + -2) + 0xc);
      uVar21 = (int)local_b0 - 4;
      local_9c = (int)local_b0 + -5;
      while ((puVar22 = local_90, puVar23 = local_c0, pMVar10 = local_c8, -1 < iVar13 &&
             (pCheck->mxErr != 0))) {
        pCheck->v2 = iVar13;
        uVar11 = *puVar19 << 8 | *puVar19 >> 8;
        uVar20 = (uint)uVar11;
        if (uVar21 < uVar11 || uVar11 <= uVar14) {
          checkAppendMsg(pCheck,"Offset %d out of range %d..%d",(ulong)uVar20,(ulong)local_94,
                         (ulong)uVar21);
          bVar7 = false;
        }
        else {
          puVar22 = local_c0 + uVar20;
          (*local_c8->xParseCell)(local_c8,puVar22,&info);
          if ((uint)local_b0 < info.nSize + uVar20) {
            checkAppendMsg(pCheck,"Extends off end of page");
            bVar7 = false;
          }
          else {
            if (pMVar10->intKey != '\0') {
              if (bVar6) {
                if (maxKey_local < info.nKey) {
LAB_0013f213:
                  checkAppendMsg(pCheck,"Rowid %lld out of order");
                }
              }
              else if (maxKey_local <= info.nKey) goto LAB_0013f213;
              bVar6 = false;
              maxKey_local = info.nKey;
            }
            if (info.nLocal < info.nPayload) {
              local_98 = ((info.nPayload + local_9c) - (uint)info.nLocal) / uVar21;
              uVar15 = sqlite3Get4byte(puVar22 + ((ulong)info.nSize - 4));
              if (local_b8->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar15,'\x03',iPage);
              }
              checkList(pCheck,0,uVar15,local_98);
            }
            if (local_c8->leaf == '\0') {
              uVar15 = sqlite3Get4byte(puVar22);
              if (local_b8->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar15,'\x05',iPage);
              }
              iVar16 = checkTreePage(pCheck,uVar15,&maxKey_local,maxKey_local);
              if (iVar16 == local_f8) {
                bVar6 = false;
              }
              else {
                bVar6 = false;
                checkAppendMsg(pCheck,"Child page depth differs");
                local_f8 = iVar16;
              }
            }
            else {
              btreeHeapInsert(aHeap,((uint)info.nSize + (uint)uVar11) - 1 | uVar20 << 0x10);
            }
          }
        }
        iVar13 = iVar13 + -1;
        puVar19 = puVar19 + -1;
      }
      *piMinKey = maxKey_local;
      pCheck->zPfx = (char *)0x0;
      if (bVar7) {
        if (0 < pCheck->mxErr) {
          if (local_c8->leaf == '\0') {
            aHeap = pCheck->heap;
            *aHeap = 0;
            for (uVar24 = (ulong)(uVar18 | (uint)local_88); 0 < (long)uVar24; uVar24 = uVar24 - 1) {
              uVar11 = *(ushort *)(puVar23 + uVar24 * 2 + uVar17 + (ulong)bVar4 * -4 + 10) << 8 |
                       *(ushort *)(puVar23 + uVar24 * 2 + uVar17 + (ulong)bVar4 * -4 + 10) >> 8;
              uVar12 = (*local_c8->xCellSize)(local_c8,local_c0 + uVar11);
              btreeHeapInsert(aHeap,((uint)uVar11 + (uint)uVar12) - 1 | (uint)uVar11 << 0x10);
            }
          }
          puVar23 = puVar22 + 1;
          puVar22 = puVar22 + 2;
          while( true ) {
            uVar11 = CONCAT11(*puVar23,*puVar22);
            uVar17 = (ulong)uVar11;
            if (uVar17 == 0) break;
            puVar23 = local_c0 + uVar17;
            puVar22 = local_c0 + uVar17 + 1;
            btreeHeapInsert(aHeap,((uint)uVar11 +
                                  (uint)(ushort)(*(ushort *)(local_c0 + uVar17 + 2) << 8 |
                                                *(ushort *)(local_c0 + uVar17 + 2) >> 8)) - 1 |
                                  (uint)uVar11 << 0x10);
          }
          uVar18 = *aHeap;
          iVar13 = 0;
          while (uVar18 != 0) {
            uVar21 = aHeap[1];
            aHeap[1] = aHeap[uVar18];
            aHeap[uVar18] = 0xffffffff;
            uVar18 = uVar18 - 1;
            *aHeap = uVar18;
            uVar17 = 1;
            while (uVar20 = (int)uVar17 * 2, uVar20 <= uVar18) {
              uVar24 = (ulong)(uVar20 | 1);
              if (aHeap[uVar20] <= aHeap[uVar24]) {
                uVar24 = (ulong)uVar20;
              }
              uVar20 = aHeap[uVar17];
              if (uVar20 < aHeap[uVar24]) break;
              aHeap[uVar17] = aHeap[uVar24];
              aHeap[uVar24] = uVar20;
              uVar17 = uVar24;
              uVar18 = *aHeap;
            }
            uVar20 = uVar21 >> 0x10;
            if (uVar20 <= (uVar14 & 0xffff)) {
              checkAppendMsg(pCheck,"Multiple uses for byte %u of page %d",(ulong)uVar20,
                             (ulong)(uint)iPage);
              if (*aHeap != 0) goto LAB_0013efac;
              break;
            }
            iVar13 = iVar13 + uVar20 + ~(uVar14 & 0xffff);
            uVar14 = uVar21;
          }
          uVar14 = (int)local_b0 + ~(uVar14 & 0xffff) + iVar13;
          if (uVar14 != local_90[7]) {
            checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %d",
                           (ulong)uVar14,(ulong)local_90[7],(ulong)(uint)iPage);
          }
        }
      }
      else {
        local_c8->isInit = uVar1;
      }
      goto LAB_0013efac;
    }
    zFormat = "btreeInitPage() returns error code %d";
  }
  else {
    zFormat = "unable to get the page. error code=%d";
  }
  checkAppendMsg(pCheck,zFormat,(ulong)uVar14);
LAB_0013efac:
  releasePage(pPage);
  pCheck->zPfx = pcVar5;
  pCheck->v1 = iVar8;
  pCheck->v2 = iVar9;
  return local_f8 + 1;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %d cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %d at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      int nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. 
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize );  /* Enforced by btreeInitPage() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( (u32)j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or 
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    ** 
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.  
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %d", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}